

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser.cxx
# Opt level: O2

void __thiscall Fl_Browser::textsize(Fl_Browser *this,Fl_Fontsize newSize)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar2;
  
  if ((this->super_Fl_Browser_).textsize_ != newSize) {
    (this->super_Fl_Browser_).textsize_ = newSize;
    Fl_Browser_::new_list(&this->super_Fl_Browser_);
    this->full_height_ = 0;
    if (this->lines != 0) {
      iVar1 = (*(this->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[10])(this);
      lVar2 = CONCAT44(extraout_var,iVar1);
      while (lVar2 != 0) {
        iVar1 = (*(this->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[0xe])
                          (this,lVar2);
        this->full_height_ = this->full_height_ + iVar1;
        iVar1 = (*(this->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[0xb])
                          (this,lVar2);
        lVar2 = CONCAT44(extraout_var_00,iVar1);
      }
    }
  }
  return;
}

Assistant:

void Fl_Browser::textsize(Fl_Fontsize newSize) {
  if (newSize == textsize())
    return; // avoid recalculation
  Fl_Browser_::textsize(newSize);
  new_list();
  full_height_ = 0;
  if (lines == 0) return;
  for (FL_BLINE* itm=(FL_BLINE *)item_first(); itm; itm=(FL_BLINE *)item_next(itm)) {
    full_height_ += item_height(itm);
  }
}